

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O3

int utf8_isInvalid4(ENCODING *UNUSED_enc,char *p)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  
  uVar2 = 1;
  if ((p[3] < -0x40) && (p[2] < -0x40)) {
    bVar1 = p[1];
    if (*p == -0x10) {
      bVar4 = (byte)(bVar1 + 0x40) < 0xd0;
    }
    else {
      bVar4 = true;
      if ((char)bVar1 < '\0') {
        bVar3 = 0xbf;
        if (*p == -0xc) {
          bVar3 = 0x8f;
        }
        bVar4 = bVar3 < bVar1;
      }
    }
    uVar2 = (uint)bVar4;
  }
  return uVar2;
}

Assistant:

static int PTRFASTCALL
utf8_isInvalid4(const ENCODING *UNUSED_P(enc), const char *p)
{
  return UTF8_INVALID4((const unsigned char *)p);
}